

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  bool bVar1;
  PolicyStatus PVar2;
  PolicyID id_00;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id_01;
  allocator<char> local_62;
  allocator<char> local_61;
  string msg;
  string local_40;
  
  if (status != NEW) {
    PVar2 = cmPolicies::GetPolicyStatus(id);
    if (PVar2 == REQUIRED_ALWAYS) {
      cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_00);
      IssueMessage(this,FATAL_ERROR,&msg);
      std::__cxx11::string::~string((string *)&msg);
      return false;
    }
    if (((int)id < 0x6d && status == OLD) &&
       (((bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), !bVar1 ||
         (0x27 < id - CMP0065)) || ((0x8004040001U >> ((ulong)(id - CMP0065) & 0x3f) & 1) == 0)))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"CMAKE_WARN_DEPRECATED",&local_61);
      bVar1 = IsSet(this,&msg);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"CMAKE_WARN_DEPRECATED",&local_62);
        bVar1 = IsOn(this,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&msg);
        id_01 = extraout_EDX;
        if (!bVar1) goto LAB_00198435;
      }
      else {
        std::__cxx11::string::~string((string *)&msg);
        id_01 = extraout_EDX_00;
      }
      cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_01);
      IssueMessage(this,DEPRECATION_WARNING,&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
LAB_00198435:
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(MessageType::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0108 &&
      !(this->GetCMakeInstance()->GetIsInTryCompile() &&
        (
          // Policies set by cmCoreTryCompile::TryCompileCode.
          id == cmPolicies::CMP0065 || id == cmPolicies::CMP0083 ||
          id == cmPolicies::CMP0091 || id == cmPolicies::CMP0104)) &&
      (!this->IsSet("CMAKE_WARN_DEPRECATED") ||
       this->IsOn("CMAKE_WARN_DEPRECATED"))) {
    this->IssueMessage(MessageType::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}